

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

void __thiscall
wabt::ExprVisitor::PushExprlist(ExprVisitor *this,State state,Expr *expr,ExprList *expr_list)

{
  iterator local_38;
  ExprList *local_28;
  ExprList *expr_list_local;
  Expr *expr_local;
  ExprVisitor *pEStack_10;
  State state_local;
  ExprVisitor *this_local;
  
  local_28 = expr_list;
  expr_list_local = (ExprList *)expr;
  expr_local._4_4_ = state;
  pEStack_10 = this;
  std::vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>>::
  emplace_back<wabt::ExprVisitor::State&>
            ((vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>> *)
             &this->state_stack_,(State *)((long)&expr_local + 4));
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,
             (Expr **)&expr_list_local);
  local_38 = intrusive_list<wabt::Expr>::begin(local_28);
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::emplace_back<wabt::intrusive_list<wabt::Expr>::iterator>(&this->expr_iter_stack_,&local_38);
  return;
}

Assistant:

void ExprVisitor::PushExprlist(State state, Expr* expr, ExprList& expr_list) {
  state_stack_.emplace_back(state);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
}